

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::lookingAtDecimal(SelectionCompiler *this,bool param_1)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  
  uVar2 = this->ichToken;
  lVar11 = (long)(int)uVar2;
  uVar3 = this->cchScript;
  if (uVar2 != uVar3) {
    pcVar4 = (this->script)._M_dataplus._M_p;
    uVar10 = (pcVar4[lVar11] == '-') + uVar2;
    if ((int)uVar10 < (int)uVar3) {
      uVar8 = (ulong)(pcVar4[lVar11] == '-');
      lVar1 = lVar11 + uVar8;
      cVar6 = pcVar4[lVar1];
      iVar7 = (int)cVar6;
      bVar12 = iVar7 - 0x30U < 10;
      if (bVar12) {
        lVar11 = uVar8 + lVar11;
        do {
          cVar6 = (char)iVar7;
          lVar11 = lVar11 + 1;
          uVar5 = uVar3;
          if ((int)uVar3 <= lVar11) break;
          cVar6 = pcVar4[lVar11];
          iVar7 = (int)cVar6;
          uVar10 = uVar10 + 1;
          uVar5 = uVar10;
        } while (iVar7 - 0x30U < 10);
      }
      else {
        uVar5 = (uint)lVar1;
      }
      uVar10 = uVar5;
      bVar13 = cVar6 != '.';
    }
    else {
      bVar13 = true;
      bVar12 = false;
    }
    if (uVar10 == uVar3) {
      return false;
    }
    if (bVar13) {
      return false;
    }
    if (((int)uVar10 < 1) || (iVar7 = isalpha((int)pcVar4[(ulong)uVar10 - 1]), iVar7 == 0)) {
      uVar8 = (long)(int)uVar10 + 1;
      if (((int)uVar8 < (int)uVar3) && ((int)pcVar4[uVar8] - 0x30U < 10)) {
        pcVar9 = pcVar4 + uVar8;
        do {
          pcVar9 = pcVar9 + 1;
          bVar12 = true;
          if ((2 - uVar3) + (int)uVar8 == 1) {
            uVar8 = (ulong)uVar3;
            break;
          }
          uVar8 = (ulong)((int)uVar8 + 1);
        } while ((int)*pcVar9 - 0x30U < 10);
      }
      this->cchToken = (int)uVar8 - uVar2;
      return bVar12;
    }
  }
  return false;
}

Assistant:

bool SelectionCompiler::lookingAtDecimal(bool) {
    if (ichToken == cchScript) { return false; }

    int ichT = ichToken;
    if (script[ichT] == '-') { ++ichT; }
    bool digitSeen = false;
    char ch        = 'X';
    while (ichT < cchScript && std::isdigit(ch = script[ichT])) {
      ++ichT;
      digitSeen = true;
    }

    if (ichT == cchScript || ch != '.') { return false; }

    // to support DMPC.1, let's check the character before the dot
    if (ch == '.' && (ichT > 0) && std::isalpha(script[ichT - 1])) {
      return false;
    }

    ++ichT;
    while (ichT < cchScript && std::isdigit(script[ichT])) {
      ++ichT;
      digitSeen = true;
    }
    cchToken = ichT - ichToken;
    return digitSeen;
  }